

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O3

int pkey_dh_init(EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  
  pvVar1 = OPENSSL_zalloc(4);
  if (pvVar1 != (void *)0x0) {
    ctx->data = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static int pkey_dh_init(EVP_PKEY_CTX *ctx) {
  DH_PKEY_CTX *dctx =
      reinterpret_cast<DH_PKEY_CTX *>(OPENSSL_zalloc(sizeof(DH_PKEY_CTX)));
  if (dctx == NULL) {
    return 0;
  }

  ctx->data = dctx;
  return 1;
}